

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O0

PDFRectangle * __thiscall
PDFDocumentHandler::DeterminePageBox
          (PDFRectangle *__return_storage_ptr__,PDFDocumentHandler *this,PDFDictionary *inDictionary
          ,EPDFPageBox inPageBoxType)

{
  PDFRectangle local_f0;
  PDFRectangle local_d0;
  PDFRectangle local_b0;
  PDFRectangle local_90;
  PDFRectangle local_70;
  undefined1 local_50 [8];
  PDFPageInput pageInput;
  EPDFPageBox inPageBoxType_local;
  PDFDictionary *inDictionary_local;
  PDFDocumentHandler *this_local;
  PDFRectangle *result;
  
  PDFRectangle::PDFRectangle(__return_storage_ptr__);
  RefCountObject::AddRef((RefCountObject *)inDictionary);
  PDFPageInput::PDFPageInput((PDFPageInput *)local_50,this->mParser,&inDictionary->super_PDFObject);
  switch(inPageBoxType) {
  case ePDFPageBoxMediaBox:
    PDFPageInput::GetMediaBox(&local_70,(PDFPageInput *)local_50);
    __return_storage_ptr__->LowerLeftX = local_70.LowerLeftX;
    __return_storage_ptr__->LowerLeftY = local_70.LowerLeftY;
    __return_storage_ptr__->UpperRightX = local_70.UpperRightX;
    __return_storage_ptr__->UpperRightY = local_70.UpperRightY;
    PDFRectangle::~PDFRectangle(&local_70);
    break;
  case ePDFPageBoxCropBox:
    PDFPageInput::GetCropBox(&local_90,(PDFPageInput *)local_50);
    __return_storage_ptr__->LowerLeftX = local_90.LowerLeftX;
    __return_storage_ptr__->LowerLeftY = local_90.LowerLeftY;
    __return_storage_ptr__->UpperRightX = local_90.UpperRightX;
    __return_storage_ptr__->UpperRightY = local_90.UpperRightY;
    PDFRectangle::~PDFRectangle(&local_90);
    break;
  case ePDFPageBoxBleedBox:
    PDFPageInput::GetBleedBox(&local_b0,(PDFPageInput *)local_50);
    __return_storage_ptr__->LowerLeftX = local_b0.LowerLeftX;
    __return_storage_ptr__->LowerLeftY = local_b0.LowerLeftY;
    __return_storage_ptr__->UpperRightX = local_b0.UpperRightX;
    __return_storage_ptr__->UpperRightY = local_b0.UpperRightY;
    PDFRectangle::~PDFRectangle(&local_b0);
    break;
  case ePDFPageBoxTrimBox:
    PDFPageInput::GetTrimBox(&local_d0,(PDFPageInput *)local_50);
    __return_storage_ptr__->LowerLeftX = local_d0.LowerLeftX;
    __return_storage_ptr__->LowerLeftY = local_d0.LowerLeftY;
    __return_storage_ptr__->UpperRightX = local_d0.UpperRightX;
    __return_storage_ptr__->UpperRightY = local_d0.UpperRightY;
    PDFRectangle::~PDFRectangle(&local_d0);
    break;
  case ePDFPageBoxArtBox:
    PDFPageInput::GetArtBox(&local_f0,(PDFPageInput *)local_50);
    __return_storage_ptr__->LowerLeftX = local_f0.LowerLeftX;
    __return_storage_ptr__->LowerLeftY = local_f0.LowerLeftY;
    __return_storage_ptr__->UpperRightX = local_f0.UpperRightX;
    __return_storage_ptr__->UpperRightY = local_f0.UpperRightY;
    PDFRectangle::~PDFRectangle(&local_f0);
  }
  PDFPageInput::~PDFPageInput((PDFPageInput *)local_50);
  return __return_storage_ptr__;
}

Assistant:

PDFRectangle PDFDocumentHandler::DeterminePageBox(PDFDictionary* inDictionary,EPDFPageBox inPageBoxType)
{
	PDFRectangle result;
    inDictionary->AddRef();
    PDFPageInput pageInput(mParser,inDictionary);

	switch(inPageBoxType)
	{
		case ePDFPageBoxMediaBox:
			result = pageInput.GetMediaBox();
            break;
		case ePDFPageBoxCropBox:
		{
            result = pageInput.GetCropBox();
			break;
		}
		case ePDFPageBoxBleedBox:
		{
            result = pageInput.GetBleedBox();
			break;
		}
		case ePDFPageBoxTrimBox:
		{
            result = pageInput.GetTrimBox();
			break;
		}
		case ePDFPageBoxArtBox:
		{
            result = pageInput.GetArtBox();
			break;
		}
	}
	return result;
}